

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_append_text_utf8(nk_str *str,char *text,int len)

{
  int iVar1;
  nk_rune local_30;
  int local_2c;
  nk_rune unicode;
  int byte_len;
  int i;
  int len_local;
  char *text_local;
  nk_str *str_local;
  
  local_2c = 0;
  if (((str == (nk_str *)0x0) || (text == (char *)0x0)) || (len == 0)) {
    str_local._4_4_ = 0;
  }
  else {
    byte_len = len;
    _i = text;
    text_local = (char *)str;
    for (unicode = 0; (int)unicode < byte_len; unicode = unicode + 1) {
      iVar1 = nk_utf_decode(_i + local_2c,&local_30,4);
      local_2c = iVar1 + local_2c;
    }
    nk_str_append_text_char((nk_str *)text_local,_i,local_2c);
    str_local._4_4_ = byte_len;
  }
  return str_local._4_4_;
}

Assistant:

NK_API int
nk_str_append_text_utf8(struct nk_str *str, const char *text, int len)
{
    int i = 0;
    int byte_len = 0;
    nk_rune unicode;
    if (!str || !text || !len) return 0;
    for (i = 0; i < len; ++i)
        byte_len += nk_utf_decode(text+byte_len, &unicode, 4);
    nk_str_append_text_char(str, text, byte_len);
    return len;
}